

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O0

_Bool container_iterator_read_into_uint64
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint64_t high48,
                uint64_t *buf,uint32_t count,uint32_t *consumed,uint16_t *value_out)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong in_RCX;
  int *in_RDX;
  char in_SIL;
  int *in_RDI;
  ulong *in_R8;
  uint32_t in_R9D;
  bool bVar4;
  uint *in_stack_00000008;
  ushort *in_stack_00000010;
  uint32_t i_1;
  uint32_t num_values_1;
  uint32_t largest_run_value;
  run_container_t *rc;
  uint32_t i;
  uint32_t num_values;
  array_container_t *ac;
  uint64_t word;
  uint32_t wordindex;
  bitset_container_t *bc;
  uint local_74;
  uint local_60;
  unsigned_long_long local_50;
  uint local_44;
  ulong *local_30;
  _Bool local_1;
  
  *in_stack_00000008 = 0;
  if (in_R9D == 0) {
    local_1 = false;
  }
  else {
    local_30 = in_R8;
    if (in_SIL == '\x01') {
      local_44 = *in_RDX / 0x40;
      local_50 = *(ulong *)(*(long *)(in_RDI + 2) + (ulong)local_44 * 8) &
                 -1L << ((byte)((long)*in_RDX % 0x40) & 0x3f);
      do {
        while( true ) {
          bVar4 = false;
          if (local_50 != 0) {
            bVar4 = *in_stack_00000008 < in_R9D;
          }
          if (!bVar4) break;
          iVar1 = roaring_trailing_zeroes(local_50);
          *local_30 = in_RCX | local_44 * 0x40 + iVar1;
          local_50 = local_50 & local_50 - 1;
          local_30 = local_30 + 1;
          *in_stack_00000008 = *in_stack_00000008 + 1;
        }
        while (local_50 == 0 && local_44 + 1 < 0x400) {
          local_44 = local_44 + 1;
          local_50 = *(unsigned_long_long *)(*(long *)(in_RDI + 2) + (ulong)local_44 * 8);
        }
        bVar4 = false;
        if (local_50 != 0) {
          bVar4 = *in_stack_00000008 < in_R9D;
        }
      } while (bVar4);
      if (local_50 == 0) {
        local_1 = false;
      }
      else {
        iVar1 = roaring_trailing_zeroes(local_50);
        *in_RDX = local_44 * 0x40 + iVar1;
        *in_stack_00000010 = (ushort)*in_RDX;
        local_1 = true;
      }
    }
    else if (in_SIL == '\x02') {
      uVar3 = minimum_uint32(*in_RDI - *in_RDX,in_R9D);
      for (local_60 = 0; local_60 < uVar3; local_60 = local_60 + 1) {
        in_R8[local_60] =
             in_RCX | *(ushort *)(*(long *)(in_RDI + 2) + (ulong)(*in_RDX + local_60) * 2);
      }
      *in_stack_00000008 = uVar3 + *in_stack_00000008;
      *in_RDX = uVar3 + *in_RDX;
      if (*in_RDX < *in_RDI) {
        *in_stack_00000010 = *(ushort *)(*(long *)(in_RDI + 2) + (long)*in_RDX * 2);
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      do {
        uVar2 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)*in_RDX * 4) +
                (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)*in_RDX * 4);
        uVar3 = minimum_uint32((uVar2 - *in_stack_00000010) + 1,in_R9D - *in_stack_00000008);
        for (local_74 = 0; local_74 < uVar3; local_74 = local_74 + 1) {
          local_30[local_74] = in_RCX | *in_stack_00000010 + local_74;
        }
        *in_stack_00000010 = *in_stack_00000010 + (short)uVar3;
        local_30 = local_30 + uVar3;
        *in_stack_00000008 = uVar3 + *in_stack_00000008;
        if ((uVar2 < *in_stack_00000010) || (*in_stack_00000010 == 0)) {
          *in_RDX = *in_RDX + 1;
          if (*in_RDI <= *in_RDX) {
            return false;
          }
          *in_stack_00000010 = *(ushort *)(*(long *)(in_RDI + 2) + (long)*in_RDX * 4);
        }
      } while (*in_stack_00000008 < in_R9D);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool container_iterator_read_into_uint64(const container_t *c, uint8_t typecode,
                                         roaring_container_iterator_t *it,
                                         uint64_t high48, uint64_t *buf,
                                         uint32_t count, uint32_t *consumed,
                                         uint16_t *value_out) {
    *consumed = 0;
    if (count == 0) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            uint32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX << (it->index % 64));
            do {
                // Read set bits.
                while (word != 0 && *consumed < count) {
                    *buf = high48 |
                           (wordindex * 64 + roaring_trailing_zeroes(word));
                    word = word & (word - 1);
                    buf++;
                    (*consumed)++;
                }
                // Skip unset bits.
                while (word == 0 &&
                       wordindex + 1 < BITSET_CONTAINER_SIZE_IN_WORDS) {
                    wordindex++;
                    word = bc->words[wordindex];
                }
            } while (word != 0 && *consumed < count);

            if (word != 0) {
                it->index = wordindex * 64 + roaring_trailing_zeroes(word);
                *value_out = it->index;
                return true;
            }
            return false;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            uint32_t num_values =
                minimum_uint32(ac->cardinality - it->index, count);
            for (uint32_t i = 0; i < num_values; i++) {
                buf[i] = high48 | ac->array[it->index + i];
            }
            *consumed += num_values;
            it->index += num_values;
            if (it->index < ac->cardinality) {
                *value_out = ac->array[it->index];
                return true;
            }
            return false;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            do {
                uint32_t largest_run_value =
                    rc->runs[it->index].value + rc->runs[it->index].length;
                uint32_t num_values = minimum_uint32(
                    largest_run_value - *value_out + 1, count - *consumed);
                for (uint32_t i = 0; i < num_values; i++) {
                    buf[i] = high48 | (*value_out + i);
                }
                *value_out += num_values;
                buf += num_values;
                *consumed += num_values;

                // We check for `value == 0` because `it->value += num_values`
                // can overflow when `value == UINT16_MAX`, and `count >
                // length`. In this case `value` will overflow to 0.
                if (*value_out > largest_run_value || *value_out == 0) {
                    it->index++;
                    if (it->index < rc->n_runs) {
                        *value_out = rc->runs[it->index].value;
                    } else {
                        return false;
                    }
                }
            } while (*consumed < count);
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return 0;
    }
}